

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O1

char * serialize_get(char *r,SBufExt *sbx,TValue *o)

{
  TValue *pTVar1;
  long lVar2;
  uint64_t *w;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar3;
  uint32_t hbits;
  uint32_t uVar4;
  GCstr *pGVar5;
  void *pvVar6;
  GCtab *t;
  ulong uVar7;
  char *r_00;
  TValue *pTVar8;
  short sVar9;
  uint64_t uVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  ErrMsg em;
  lua_State *L;
  uint64_t *r_01;
  byte *r_02;
  uint64_t *puVar14;
  bool bVar15;
  uint32_t tp;
  uint32_t nhash;
  uint32_t idx;
  uint32_t narray;
  ulong local_40;
  undefined8 *local_38;
  
  w = (uint64_t *)sbx->w;
  if (r < w) {
    r_01 = (uint64_t *)(r + 1);
    tp = (uint32_t)(byte)*r;
    if (0xdf < tp) {
      r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&tp);
    }
  }
  else {
    r_01 = (uint64_t *)0x0;
  }
  if (r_01 == (uint64_t *)0x0) goto LAB_001072bf;
  uVar11 = (ulong)tp;
  if (0x1f < uVar11) {
    uVar13 = tp - 0x20;
    if (uVar13 <= (uint)((int)w - (int)r_01)) {
      pGVar5 = lj_str_new((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),(char *)r_01,
                          (ulong)uVar13);
      o->u64 = (ulong)pGVar5 | 0xfffd800000000000;
      return (char *)(byte *)((long)r_01 + (ulong)uVar13);
    }
    goto LAB_001072bf;
  }
  if (uVar11 == 7) {
    if (r_01 + 1 <= w) {
      uVar10 = 0xfff8000000000000;
      if ((ushort)(*r_01 >> 0x30) < 0xfff9) {
        uVar10 = *r_01;
      }
      o->u64 = uVar10;
      return (char *)(r_01 + 1);
    }
    goto LAB_001072bf;
  }
  if (tp == 6) {
    if ((uint64_t *)((long)r_01 + 4U) <= w) {
      o->n = (double)(int)(uint)*r_01;
      return (char *)(uint64_t *)((long)r_01 + 4U);
    }
    goto LAB_001072bf;
  }
  if (tp < 3) {
    o->u64 = ~(uVar11 << 0x2f);
    return (char *)r_01;
  }
  if (tp == 0xf) {
    if (r_01 < w) {
      r_02 = (byte *)((long)r_01 + 1);
      idx = (uint32_t)(byte)*r_01;
      if (0xdf < idx) {
        r_02 = (byte *)serialize_ru124_((char *)r_02,(char *)w,&idx);
      }
    }
    else {
      r_02 = (byte *)0x0;
    }
    if (r_02 == (byte *)0x0) goto LAB_001072bf;
    idx = idx + 1;
    uVar11 = (ulong)idx;
    uVar10 = (sbx->dict_str).gcptr64;
    if (((uVar10 != 0) && (idx < *(uint *)(uVar10 + 0x30))) &&
       (aVar3 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)(*(long *)(uVar10 + 0x10) + uVar11 * 8),
       aVar3.it >> 0xf == 0x1fffb)) {
      o->field_4 = aVar3;
      if (r_02 != (byte *)0x0) {
        return (char *)r_02;
      }
      goto LAB_001072bf;
    }
LAB_001073af:
    uVar7 = (sbx->L).ptr64;
    em = LJ_ERR_BUFFER_BADDICTX;
    goto LAB_001073bc;
  }
  if (tp - 8 < 7) {
    narray = 0;
    nhash = 0;
    if (sbx->depth < 1) {
      lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
    }
    sbx->depth = sbx->depth + -1;
    if (tp == 0xe) {
      if (r_01 < w) {
        puVar14 = (uint64_t *)((long)r_01 + 1);
        idx = (uint32_t)(byte)*r_01;
        if (0xdf < idx) {
          puVar14 = (uint64_t *)serialize_ru124_((char *)puVar14,(char *)w,&idx);
        }
      }
      else {
        puVar14 = (uint64_t *)0x0;
      }
      cVar12 = '\x02';
      if (puVar14 == (uint64_t *)0x0) {
        local_40 = 0;
        r_01 = (uint64_t *)0x0;
LAB_00107320:
        bVar15 = false;
      }
      else {
        idx = idx + 1;
        uVar11 = (ulong)idx;
        uVar10 = (sbx->dict_mt).gcptr64;
        if (((uVar10 == 0) || (*(uint *)(uVar10 + 0x30) <= idx)) ||
           (local_40 = *(ulong *)(*(long *)(uVar10 + 0x10) + uVar11 * 8),
           (local_40 & 0xffff800000000000) != 0xfffa000000000000)) goto LAB_001073af;
        if (puVar14 < w) {
          r_01 = (uint64_t *)((long)puVar14 + 1);
          tp = (uint32_t)(byte)*puVar14;
          if (0xdf < tp) {
            r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&tp);
          }
        }
        else {
          r_01 = (uint64_t *)0x0;
        }
        local_40 = local_40 & 0x7fffffffffff;
        if (r_01 == (uint64_t *)0x0) goto LAB_00107320;
        bVar15 = tp - 8 < 6;
        cVar12 = !bVar15 * '\x03';
      }
      if (bVar15) goto LAB_00107117;
    }
    else {
      local_40 = 0;
LAB_00107117:
      uVar4 = tp;
      if (tp < 10) {
LAB_0010714d:
        if ((uVar4 & 1) != 0) {
          if (r_01 < w) {
            uVar10 = *r_01;
            r_01 = (uint64_t *)((long)r_01 + 1);
            nhash = (uint32_t)(byte)uVar10;
            if (0xdf < nhash) {
              r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&nhash);
            }
          }
          else {
            r_01 = (uint64_t *)0x0;
          }
          if (r_01 == (uint64_t *)0x0) goto LAB_00107303;
        }
        uVar11 = (ulong)narray;
        uVar13 = 0x1f;
        if (nhash - 1 != 0) {
          for (; nhash - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        hbits = (uVar13 ^ 0xffffffe0) + 0x21;
        if (nhash < 2) {
          hbits = nhash;
        }
        t = lj_tab_new((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),narray,hbits);
        (t->metatable).gcptr64 = local_40;
        o->u64 = (ulong)t | 0xfffa000000000000;
        if ((uVar11 != 0) && (uVar7 = (ulong)(0xb < uVar4), uVar7 < uVar11)) {
          uVar10 = (t->array).ptr64;
          pTVar8 = (TValue *)(uVar10 + uVar7 * 8);
          do {
            pTVar1 = pTVar8 + 1;
            r_01 = (uint64_t *)serialize_get((char *)r_01,sbx,pTVar8);
            pTVar8 = pTVar1;
          } while (pTVar1 < (TValue *)(uVar10 + uVar11 * 8));
        }
        if (nhash != 0) {
          do {
            r_00 = serialize_get((char *)r_01,sbx,(cTValue *)&idx);
            pTVar8 = lj_tab_set((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),t,(cTValue *)&idx
                               );
            if (pTVar8->u64 != 0xffffffffffffffff) {
              lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DUPKEY)
              ;
            }
            r_01 = (uint64_t *)serialize_get(r_00,sbx,pTVar8);
            nhash = nhash - 1;
          } while (nhash != 0);
        }
        sbx->depth = sbx->depth + 1;
        cVar12 = '\0';
      }
      else {
        if (r_01 < w) {
          uVar10 = *r_01;
          r_01 = (uint64_t *)((long)r_01 + 1);
          narray = (uint32_t)(byte)uVar10;
          if (0xdf < narray) {
            r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&narray);
          }
        }
        else {
          r_01 = (uint64_t *)0x0;
        }
        if (r_01 != (uint64_t *)0x0) goto LAB_0010714d;
LAB_00107303:
        cVar12 = '\x02';
      }
    }
    if (cVar12 == '\x02') {
LAB_001072bf:
      lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_EOB);
    }
    if (cVar12 != '\x03') {
      return (char *)r_01;
    }
  }
  else if (tp - 0x10 < 3) {
    bVar15 = tp == 0x12;
    if (w < r_01 + (ulong)bVar15 + 1) {
      uVar13 = 2;
    }
    else {
      L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
      if (*(long *)((L->glref).ptr64 + 0x180) == 0) {
        uVar13 = 3;
      }
      else {
        lVar2 = (ulong)bVar15 * 8;
        local_40 = lVar2 + 8;
        local_38 = (undefined8 *)(ulong)(uVar11 != 0x11);
        pvVar6 = lj_mem_newgco(L,lVar2 + 0x18);
        *(undefined1 *)((long)pvVar6 + 9) = 10;
        sVar9 = 0xb;
        if (uVar11 != 0x10) {
          sVar9 = (short)local_38 * 4 + 0xc;
        }
        *(short *)((long)pvVar6 + 10) = sVar9;
        local_38 = (undefined8 *)((long)pvVar6 + 0x10);
        memcpy(local_38,r_01,local_40);
        if (uVar11 == 0x12) {
          if (0xfff8 < *(ushort *)((long)local_38 + 6)) {
            *local_38 = 0xfff8000000000000;
          }
          if (0xfff8ffffffffffff < *(ulong *)((long)pvVar6 + 0x18)) {
            *(undefined8 *)((long)pvVar6 + 0x18) = 0xfff8000000000000;
          }
        }
        o->u64 = (ulong)pvVar6 | 0xfffa800000000000;
        uVar13 = 0;
        r_01 = r_01 + (ulong)bVar15 + 1;
      }
    }
    if (uVar13 < 2) {
      return (char *)r_01;
    }
    if (uVar13 == 2) goto LAB_001072bf;
  }
  else if (tp < 6) {
    if (uVar11 == 5) {
      puVar14 = r_01 + 1;
      if (puVar14 <= w) {
        pvVar6 = (void *)*r_01;
        goto LAB_00107295;
      }
LAB_001073a8:
      bVar15 = false;
    }
    else {
      if (tp == 4) {
        puVar14 = (uint64_t *)((long)r_01 + 4);
        if (w < puVar14) goto LAB_001073a8;
        pvVar6 = (void *)(ulong)(uint)*r_01;
      }
      else {
        pvVar6 = (void *)0x0;
        puVar14 = r_01;
      }
LAB_00107295:
      pvVar6 = lj_lightud_intern((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),pvVar6);
      o->u64 = (ulong)pvVar6 | 0xfffe000000000000;
      bVar15 = true;
      r_01 = puVar14;
    }
    if (bVar15) {
      return (char *)r_01;
    }
    goto LAB_001072bf;
  }
  uVar7 = (sbx->L).ptr64;
  uVar11 = (ulong)tp;
  em = LJ_ERR_BUFFER_BADDEC;
LAB_001073bc:
  lj_err_callerv((lua_State *)(uVar7 & 0xfffffffffffffff8),em,uVar11);
}

Assistant:

static char *serialize_get(char *r, SBufExt *sbx, TValue *o)
{
  char *w = sbx->w;
  uint32_t tp;
  r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
  if (LJ_LIKELY(tp >= SER_TAG_STR)) {
    uint32_t len = tp - SER_TAG_STR;
    if (LJ_UNLIKELY(len > (uint32_t)(w - r))) goto eob;
    setstrV(sbufL(sbx), o, lj_str_new(sbufL(sbx), r, len));
    r += len;
  } else if (tp == SER_TAG_INT) {
    if (LJ_UNLIKELY(r + 4 > w)) goto eob;
    setintV(o, (int32_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r)));
    r += 4;
  } else if (tp == SER_TAG_NUM) {
    if (LJ_UNLIKELY(r + 8 > w)) goto eob;
    memcpy(o, r, 8); r += 8;
#if LJ_BE
    o->u64 = lj_bswap64(o->u64);
#endif
    if (!tvisnum(o)) setnanV(o);  /* Fix non-canonical NaNs. */
  } else if (tp <= SER_TAG_TRUE) {
    setpriV(o, ~tp);
  } else if (tp == SER_TAG_DICT_STR) {
    GCtab *dict_str;
    uint32_t idx;
    r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
    idx++;
    dict_str = tabref(sbx->dict_str);
    if (dict_str && idx < dict_str->asize && tvisstr(arrayslot(dict_str, idx)))
      copyTV(sbufL(sbx), o, arrayslot(dict_str, idx));
    else
      lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
  } else if (tp >= SER_TAG_TAB && tp <= SER_TAG_DICT_MT) {
    uint32_t narray = 0, nhash = 0;
    GCtab *t, *mt = NULL;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (tp == SER_TAG_DICT_MT) {
      GCtab *dict_mt;
      uint32_t idx;
      r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
      idx++;
      dict_mt = tabref(sbx->dict_mt);
      if (dict_mt && idx < dict_mt->asize && tvistab(arrayslot(dict_mt, idx)))
	mt = tabV(arrayslot(dict_mt, idx));
      else
	lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
      r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
      if (!(tp >= SER_TAG_TAB && tp < SER_TAG_DICT_MT)) goto badtag;
    }
    if (tp >= SER_TAG_TAB+2) {
      r = serialize_ru124(r, w, &narray); if (LJ_UNLIKELY(!r)) goto eob;
    }
    if ((tp & 1)) {
      r = serialize_ru124(r, w, &nhash); if (LJ_UNLIKELY(!r)) goto eob;
    }
    t = lj_tab_new(sbufL(sbx), narray, hsize2hbits(nhash));
    /* NOBARRIER: The table is new (marked white). */
    setgcref(t->metatable, obj2gco(mt));
    settabV(sbufL(sbx), o, t);
    if (narray) {
      TValue *oa = tvref(t->array) + (tp >= SER_TAG_TAB+4);
      TValue *oe = tvref(t->array) + narray;
      while (oa < oe) r = serialize_get(r, sbx, oa++);
    }
    if (nhash) {
      do {
	TValue k, *v;
	r = serialize_get(r, sbx, &k);
	v = lj_tab_set(sbufL(sbx), t, &k);
	if (LJ_UNLIKELY(!tvisnil(v)))
	  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DUPKEY);
	r = serialize_get(r, sbx, v);
      } while (--nhash);
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tp >= SER_TAG_INT64 &&  tp <= SER_TAG_COMPLEX) {
    uint32_t sz = tp == SER_TAG_COMPLEX ? 16 : 8;
    GCcdata *cd;
    if (LJ_UNLIKELY(r + sz > w)) goto eob;
    if (LJ_UNLIKELY(!ctype_ctsG(G(sbufL(sbx))))) goto badtag;
    cd = lj_cdata_new_(sbufL(sbx),
	   tp == SER_TAG_INT64 ? CTID_INT64 :
	   tp == SER_TAG_UINT64 ? CTID_UINT64 : CTID_COMPLEX_DOUBLE,
	   sz);
    memcpy(cdataptr(cd), r, sz); r += sz;
#if LJ_BE
    *(uint64_t *)cdataptr(cd) = lj_bswap64(*(uint64_t *)cdataptr(cd));
    if (sz == 16)
      ((uint64_t *)cdataptr(cd))[1] = lj_bswap64(((uint64_t *)cdataptr(cd))[1]);
#endif
    if (sz == 16) {  /* Fix non-canonical NaNs. */
      TValue *cdo = (TValue *)cdataptr(cd);
      if (!tvisnum(&cdo[0])) setnanV(&cdo[0]);
      if (!tvisnum(&cdo[1])) setnanV(&cdo[1]);
    }
    setcdataV(sbufL(sbx), o, cd);
#endif
  } else if (tp <= (LJ_64 ? SER_TAG_LIGHTUD64 : SER_TAG_LIGHTUD32)) {
    uintptr_t ud = 0;
    if (tp == SER_TAG_LIGHTUD32) {
      if (LJ_UNLIKELY(r + 4 > w)) goto eob;
      ud = (uintptr_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r));
      r += 4;
    }
#if LJ_64
    else if (tp == SER_TAG_LIGHTUD64) {
      if (LJ_UNLIKELY(r + 8 > w)) goto eob;
      memcpy(&ud, r, 8); r += 8;
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
    }
    setrawlightudV(o, lj_lightud_intern(sbufL(sbx), (void *)ud));
#else
    setrawlightudV(o, (void *)ud);
#endif
  } else {
badtag:
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDEC, tp);
  }
  return r;
eob:
  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_EOB);
  return NULL;
}